

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

point3 * __thiscall camera::defocus_disk_sample(point3 *__return_storage_ptr__,camera *this)

{
  double *pdVar1;
  vec3 local_70;
  vec3 local_58;
  vec3 local_40;
  undefined1 local_28 [8];
  vec3 p;
  camera *this_local;
  
  p.e[2] = (double)this;
  random_in_unit_disk();
  pdVar1 = vec3::operator[]((vec3 *)local_28,0);
  operator*(&local_58,*pdVar1,&this->defocus_disk_u);
  operator+(&local_40,&this->center,&local_58);
  pdVar1 = vec3::operator[]((vec3 *)local_28,1);
  operator*(&local_70,*pdVar1,&this->defocus_disk_v);
  operator+(__return_storage_ptr__,&local_40,&local_70);
  return __return_storage_ptr__;
}

Assistant:

point3 defocus_disk_sample() const {
        // Returns a random point in the camera defocus disk.
        auto p = random_in_unit_disk();
        return center + (p[0] * defocus_disk_u) + (p[1] * defocus_disk_v);
    }